

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::AddError(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this,GValue *keyword,GValue *error)

{
  MemberIterator member;
  GValue errors;
  undefined1 local_40 [16];
  undefined8 uStack_30;
  
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::FindMember<rapidjson::CrtAllocator>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_40,&this->error_)
  ;
  if ((this->error_).data_.f.flags == 3) {
    if (local_40._0_8_ ==
        (ulong)(this->error_).data_.s.length * 0x20 +
        ((ulong)(this->error_).data_.s.str & 0xffffffffffff)) {
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
                (&this->error_,keyword,error,this->allocator_);
    }
    else {
      if (*(short *)(local_40._0_8_ + 0x1e) == 3) {
        local_40._8_8_ = (Ch *)0x0;
        uStack_30 = 0x4000000000000;
        GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_40 + 8),
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                   (local_40._0_8_ + 0x10),this->allocator_);
        GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                   (local_40._0_8_ + 0x10),
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_40 + 8));
        GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_40 + 8));
      }
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                 (local_40._0_8_ + 0x10),error,this->allocator_);
    }
    return;
  }
  __assert_fail("IsObject()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x4fd,
                "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

void AddError(GValue& keyword, GValue& error) {
      typename GValue::MemberIterator member = error_.FindMember(keyword);
      if (member == error_.MemberEnd())
        error_.AddMember(keyword, error, *allocator_);
      else {
        if (member->value.IsObject()) {
          GValue errors(kArrayType);
          errors.PushBack(member->value, *allocator_);
          member->value = errors;
        }
        member->value.PushBack(error, *allocator_);
      }
    }